

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setSubData
          (Texture *this,ConstPixelBufferAccess *src,int xOff,int yOff,int width,int height)

{
  int iVar1;
  int iVar2;
  deUint32 target;
  TextureFormat *format_00;
  TransferFormat TVar3;
  void *pvVar4;
  byte bVar5;
  CubeFace local_4c;
  int local_48;
  int face;
  int level_1;
  int level;
  GLenum local_38;
  GLenum GStack_34;
  TransferFormat transfer;
  TextureFormat *format;
  int height_local;
  int width_local;
  int yOff_local;
  int xOff_local;
  ConstPixelBufferAccess *src_local;
  Texture *this_local;
  
  format_00 = tcu::ConstPixelBufferAccess::getFormat(src);
  TVar3 = glu::getTransferFormat(*format_00);
  iVar1 = computePixelStore(format_00);
  glwPixelStorei(0xcf5,iVar1);
  local_38 = TVar3.format;
  GStack_34 = TVar3.dataType;
  if (this->m_type == TEXTURETYPE_2D) {
    glwBindTexture(0xde1,this->m_textureGL);
    for (face = 0; face < this->m_numMipLevels; face = face + 1) {
      bVar5 = (byte)face;
      iVar1 = de::max<int>(1,width >> (bVar5 & 0x1f));
      iVar2 = de::max<int>(1,height >> (bVar5 & 0x1f));
      pvVar4 = tcu::ConstPixelBufferAccess::getDataPtr(src);
      glwTexSubImage2D(0xde1,face,xOff >> (bVar5 & 0x1f),yOff >> (bVar5 & 0x1f),iVar1,iVar2,local_38
                       ,GStack_34,pvVar4);
    }
  }
  else if (this->m_type == TEXTURETYPE_CUBE) {
    glwBindTexture(0x8513,this->m_textureGL);
    for (local_48 = 0; local_48 < this->m_numMipLevels; local_48 = local_48 + 1) {
      for (local_4c = CUBEFACE_NEGATIVE_X; (int)local_4c < 6;
          local_4c = local_4c + CUBEFACE_POSITIVE_X) {
        target = cubeFaceToGLFace(local_4c);
        bVar5 = (byte)local_48;
        iVar1 = de::max<int>(1,width >> (bVar5 & 0x1f));
        iVar2 = de::max<int>(1,height >> (bVar5 & 0x1f));
        pvVar4 = tcu::ConstPixelBufferAccess::getDataPtr(src);
        glwTexSubImage2D(target,local_48,xOff >> (bVar5 & 0x1f),yOff >> (bVar5 & 0x1f),iVar1,iVar2,
                         local_38,GStack_34,pvVar4);
      }
    }
  }
  return;
}

Assistant:

void Texture::setSubData (const ConstPixelBufferAccess& src, const int xOff, const int yOff, const int width, const int height) const
{
	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(m_internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
			glTexSubImage2D(GL_TEXTURE_2D, level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexSubImage2D(cubeFaceToGLFace((CubeFace)face), level, xOff>>level, yOff>>level, de::max(1, width>>level), de::max(1, height>>level), transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}